

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void ns_mgr_init(ns_mgr *s,void *user_data)

{
  s->active_connections = (ns_connection *)0x0;
  s->hexdump_file = (char *)0x0;
  s->ctl[0] = -1;
  s->ctl[1] = -1;
  s->user_data = user_data;
  __sysv_signal(0xd,(__sighandler_t)0x1);
  do {
    ns_socketpair2(s->ctl,2);
  } while (s->ctl[0] == -1);
  return;
}

Assistant:

void ns_mgr_init(struct ns_mgr *s, void *user_data) {
  memset(s, 0, sizeof(*s));
  s->ctl[0] = s->ctl[1] = INVALID_SOCKET;
  s->user_data = user_data;

#ifdef _WIN32
  { WSADATA data; WSAStartup(MAKEWORD(2, 2), &data); }
#else
  // Ignore SIGPIPE signal, so if client cancels the request, it
  // won't kill the whole process.
  signal(SIGPIPE, SIG_IGN);
#endif

#ifndef NS_DISABLE_SOCKETPAIR
  do {
    ns_socketpair2(s->ctl, SOCK_DGRAM);
  } while (s->ctl[0] == INVALID_SOCKET);
#endif

#ifdef NS_ENABLE_SSL
  {static int init_done; if (!init_done) { SSL_library_init(); init_done++; }}
#endif
}